

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

int ZSTDMT_isOverlapped(buffer_t buffer,range_t range)

{
  uint uVar1;
  BYTE *rangeStart;
  void *pvVar2;
  void *pvVar3;
  
  pvVar2 = range.start;
  pvVar3 = buffer.start;
  uVar1 = 0;
  if (pvVar3 != (void *)0x0 && pvVar2 != (void *)0x0) {
    uVar1 = (uint)((pvVar3 < (void *)((long)pvVar2 + range.size) &&
                   (range.size != 0 && buffer.capacity != 0)) &&
                  pvVar2 < (void *)(buffer.capacity + (long)pvVar3));
  }
  return uVar1;
}

Assistant:

static int ZSTDMT_isOverlapped(buffer_t buffer, range_t range)
{
    BYTE const* const bufferStart = (BYTE const*)buffer.start;
    BYTE const* const rangeStart = (BYTE const*)range.start;

    if (rangeStart == NULL || bufferStart == NULL)
        return 0;

    {
        BYTE const* const bufferEnd = bufferStart + buffer.capacity;
        BYTE const* const rangeEnd = rangeStart + range.size;

        /* Empty ranges cannot overlap */
        if (bufferStart == bufferEnd || rangeStart == rangeEnd)
            return 0;

        return bufferStart < rangeEnd && rangeStart < bufferEnd;
    }
}